

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

void tinyexr::hufPackEncTable(longlong *hcode,int im,int iM,char **pcode)

{
  longlong lVar1;
  longlong lVar2;
  undefined8 *in_RCX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int zerun;
  int l;
  int lc;
  longlong c;
  char *p;
  int local_34;
  int local_2c;
  longlong local_28;
  char *local_20;
  undefined8 *local_18;
  int local_10;
  int local_c;
  long local_8;
  
  local_20 = (char *)*in_RCX;
  local_28 = 0;
  local_2c = 0;
  local_18 = in_RCX;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  do {
    if (local_10 < local_c) {
      if (0 < local_2c) {
        *local_20 = (char)(local_28 << (8U - (char)local_2c & 0x3f));
        local_20 = local_20 + 1;
      }
      *local_18 = local_20;
      return;
    }
    lVar1 = hufLength(*(longlong *)(local_8 + (long)local_c * 8));
    if ((int)lVar1 == 0) {
      local_34 = 1;
      while ((local_c < local_10 && local_34 < 0x105 &&
             (lVar2 = hufLength(*(longlong *)(local_8 + (long)(local_c + 1) * 8)), lVar2 < 1))) {
        local_c = local_c + 1;
        local_34 = local_34 + 1;
      }
      if (local_34 < 2) goto LAB_001554f8;
      if (local_34 < 6) {
        outputBits(6,(long)(local_34 + 0x39),&local_28,&local_2c,&local_20);
      }
      else {
        outputBits(6,0x3f,&local_28,&local_2c,&local_20);
        outputBits(8,(long)(local_34 + -6),&local_28,&local_2c,&local_20);
      }
    }
    else {
LAB_001554f8:
      outputBits(6,(long)(int)lVar1,&local_28,&local_2c,&local_20);
    }
    local_c = local_c + 1;
  } while( true );
}

Assistant:

void hufPackEncTable(
    const long long *hcode,  // i : encoding table [HUF_ENCSIZE]
    int im,                  // i : min hcode index
    int iM,                  // i : max hcode index
    char **pcode)            //  o: ptr to packed table (updated)
{
  char *p = *pcode;
  long long c = 0;
  int lc = 0;

  for (; im <= iM; im++) {
    int l = hufLength(hcode[im]);

    if (l == 0) {
      int zerun = 1;

      while ((im < iM) && (zerun < LONGEST_LONG_RUN)) {
        if (hufLength(hcode[im + 1]) > 0) break;
        im++;
        zerun++;
      }

      if (zerun >= 2) {
        if (zerun >= SHORTEST_LONG_RUN) {
          outputBits(6, LONG_ZEROCODE_RUN, c, lc, p);
          outputBits(8, zerun - SHORTEST_LONG_RUN, c, lc, p);
        } else {
          outputBits(6, SHORT_ZEROCODE_RUN + zerun - 2, c, lc, p);
        }
        continue;
      }
    }

    outputBits(6, l, c, lc, p);
  }

  if (lc > 0) *p++ = (unsigned char)(c << (8 - lc));

  *pcode = p;
}